

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O1

void __thiscall ElfFile::save(ElfFile *this,path *fileName)

{
  ByteArray *this_00;
  vector<ElfSection_*,_std::allocator<ElfSection_*>_> *pvVar1;
  Elf32_Half *pEVar2;
  pointer ppEVar3;
  pointer ppEVar4;
  Endianness endianness;
  vector<ElfSection_*,_std::allocator<ElfSection_*>_> *pvVar5;
  ulong uVar6;
  size_t i;
  long lVar7;
  
  this_00 = &this->fileData;
  (this->fileData).size_ = 0;
  lVar7 = 0;
  ByteArray::reserveBytes(this_00,0x34,'\0');
  do {
    switch(this->partsOrder[lVar7]) {
    case ELFPART_SEGMENTTABLE:
      ByteArray::alignSize(this_00,4);
      (this->fileHeader).e_phoff = (Elf32_Off)(this->fileData).size_;
      pEVar2 = &(this->fileHeader).e_phentsize;
      pvVar5 = (vector<ElfSection_*,_std::allocator<ElfSection_*>_> *)&this->segments;
      pvVar1 = (vector<ElfSection_*,_std::allocator<ElfSection_*>_> *)&this->segments;
      goto LAB_00177b39;
    case ELFPART_SECTIONTABLE:
      ByteArray::alignSize(this_00,4);
      (this->fileHeader).e_shoff = (Elf32_Off)(this->fileData).size_;
      pEVar2 = &(this->fileHeader).e_shentsize;
      pvVar5 = &this->sections;
      pvVar1 = &this->sections;
LAB_00177b39:
      ByteArray::reserveBytes
                (this_00,(ulong)*pEVar2 *
                         ((long)(pvVar1->
                                super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(pvVar5->
                                super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>).
                                _M_impl.super__Vector_impl_data._M_start >> 3),'\0');
      break;
    case ELFPART_SEGMENTS:
      ppEVar3 = (this->segments).super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((this->segments).super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppEVar3) {
        uVar6 = 0;
        do {
          ElfSegment::writeData(ppEVar3[uVar6],this_00);
          uVar6 = uVar6 + 1;
          ppEVar3 = (this->segments).super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar6 < (ulong)((long)(this->segments).
                                       super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 >>
                                3));
      }
      break;
    case ELFPART_SEGMENTLESSSECTIONS:
      ppEVar4 = (this->segmentlessSections).
                super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->segmentlessSections).
          super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppEVar4) {
        uVar6 = 0;
        do {
          ElfSection::writeData(ppEVar4[uVar6],this_00);
          uVar6 = uVar6 + 1;
          ppEVar4 = (this->segmentlessSections).
                    super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar6 < (ulong)((long)(this->segmentlessSections).
                                       super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar4 >>
                                3));
      }
    }
    lVar7 = lVar7 + 1;
    if (lVar7 == 4) {
      endianness = (Endianness)((this->fileHeader).e_ident[5] != '\x02');
      writeHeader(this,this_00,0,endianness);
      ppEVar3 = (this->segments).super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((this->segments).super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppEVar3) {
        uVar6 = 0;
        do {
          ElfSegment::writeHeader
                    (ppEVar3[uVar6],this_00,
                     (this->fileHeader).e_phentsize * uVar6 + (ulong)(this->fileHeader).e_phoff,
                     endianness);
          uVar6 = uVar6 + 1;
          ppEVar3 = (this->segments).super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar6 < (ulong)((long)(this->segments).
                                       super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 >>
                                3));
      }
      ppEVar4 = (this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppEVar4) {
        uVar6 = 0;
        do {
          ElfSection::writeHeader
                    (ppEVar4[uVar6],this_00,
                     (this->fileHeader).e_shentsize * uVar6 + (ulong)(this->fileHeader).e_shoff,
                     endianness);
          uVar6 = uVar6 + 1;
          ppEVar4 = (this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar6 < (ulong)((long)(this->sections).
                                       super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar4 >>
                                3));
      }
      ByteArray::toFile(this_00,fileName);
      return;
    }
  } while( true );
}

Assistant:

void ElfFile::save(const fs::path& fileName)
{
	fileData.clear();

	// reserve space for header and table data
	fileData.reserveBytes(sizeof(Elf32_Ehdr));

	for (size_t i = 0; i < 4; i++)
	{
		switch (partsOrder[i])
		{
		case ELFPART_SEGMENTTABLE:
			fileData.alignSize(4);
			fileHeader.e_phoff = (Elf32_Off) fileData.size();
			fileData.reserveBytes(segments.size()*fileHeader.e_phentsize);
			break;
		case ELFPART_SECTIONTABLE:
			fileData.alignSize(4);
			fileHeader.e_shoff = (Elf32_Off) fileData.size();
			fileData.reserveBytes(sections.size()*fileHeader.e_shentsize);
			break;
		case ELFPART_SEGMENTS:
			for (size_t i = 0; i < segments.size(); i++)
			{
				segments[i]->writeData(fileData);
			}
			break;
		case ELFPART_SEGMENTLESSSECTIONS:
			for (size_t i = 0; i < segmentlessSections.size(); i++)
			{
				segmentlessSections[i]->writeData(fileData);
			}
			break;
		}
	}

	// copy data to the tables
	Endianness endianness = getEndianness();
	writeHeader(fileData, 0, endianness);
	for (size_t i = 0; i < segments.size(); i++)
	{
		size_t pos = fileHeader.e_phoff+i*fileHeader.e_phentsize;
		segments[i]->writeHeader(fileData, pos, endianness);
	}
	
	for (size_t i = 0; i < sections.size(); i++)
	{
		size_t pos = fileHeader.e_shoff+i*fileHeader.e_shentsize;
		sections[i]->writeHeader(fileData, pos, endianness);
	}

	fileData.toFile(fileName);
}